

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O2

void flow_cutter::DistanceAwareCutter::
     compute_hop_distance_from<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
               (Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
                *graph,TemporaryData *tmp,int source,ArrayIDFunc<int> *dist)

{
  BreadthFirstSearch local_3c;
  anon_class_1_0_00000001 on_new_arc;
  anon_class_1_0_00000001 see_node;
  anon_class_1_0_00000001 was_node_seen;
  anon_class_16_2_f6f92433 should_follow_arc;
  
  should_follow_arc.dist = (ArrayIDFunc<int> *)CONCAT44(should_follow_arc.dist._4_4_,0x7fffffff);
  ArrayIDFunc<int>::fill(dist,(int *)&should_follow_arc);
  dist->data_[source] = 0;
  should_follow_arc.dist = dist;
  should_follow_arc.graph = graph;
  BreadthFirstSearch::operator()
            (&local_3c,graph,tmp,source,&was_node_seen,&see_node,&should_follow_arc,&on_new_arc);
  return;
}

Assistant:

static void compute_hop_distance_from(const Graph& graph, TemporaryData& tmp,
        int source, ArrayIDFunc<int>& dist)
    {
        dist.fill(std::numeric_limits<int>::max());
        dist[source] = 0;

        auto was_node_seen = [&](int x) { return false; };
        auto see_node = [](int x) { return true; };
        auto should_follow_arc = [&](int xy) {
            if (dist(graph.tail(xy)) < dist(graph.head(xy)) - 1) {
                dist[graph.head(xy)] = dist(graph.tail(xy)) + 1;
                return true;
            } else {
                return false;
            }
        };
        auto on_new_arc = [&](int xy) {};
        BreadthFirstSearch()(graph, tmp, source, was_node_seen, see_node,
            should_follow_arc, on_new_arc);
    }